

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TermPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,int depth)

{
  EncodedChar *pEVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  CharCount CVar5;
  CharCount CVar6;
  undefined4 *puVar7;
  EncodedChar *pEVar8;
  EncodedChar *pEVar9;
  ulong uVar10;
  HRESULT error;
  uint lineNumber;
  
  ThreadContext::ProbeStackNoDispose
            (this->scriptContext->threadContext,0x6000,this->scriptContext,(PVOID)0x0);
  pEVar9 = this->tempLocationOfSurrogatePair;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec9ef3;
    *puVar7 = 0;
  }
  pEVar8 = this->next;
  EVar4 = *pEVar8;
  if ((ushort)EVar4 < 0x3f) {
    switch(EVar4) {
    case L'$':
switchD_00ec934b_caseD_5e:
      if (pEVar8 + 1 <= this->inputLim) {
LAB_00ec94d3:
        this->next = this->next + 1;
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (bVar3) {
        *puVar7 = 0;
        goto LAB_00ec94d3;
      }
      goto LAB_00ec9ef3;
    case L'%':
    case L'&':
    case L'\'':
    case L',':
    case L'-':
      goto switchD_00ec9472_caseD_25;
    case L'(':
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      if (this->inputLim < pEVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      pEVar9 = this->next;
      this->next = pEVar9 + 1;
      if (this->inputLim < pEVar9 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      if (*this->next == L'?') {
        if (this->inputLim < this->next + 2) {
          Fail(this,-0x7ff5ec67);
        }
        if (this->inputLim < this->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9ef3;
          *puVar7 = 0;
        }
        uVar10 = (ulong)(ushort)this->next[1];
        if ((0x3d < uVar10) || ((0x2400000200000000U >> (uVar10 & 0x3f) & 1) == 0))
        goto LAB_00ec9da9;
        if (this->inputLim < this->next + 2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar3) goto LAB_00ec9ef3;
          *puVar7 = 0;
        }
        this->next = this->next + 2;
      }
      else {
LAB_00ec9da9:
        this->numGroups = this->numGroups + 1;
      }
      DisjunctionPass0(this,depth + 1);
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      if (*this->next != L')') {
        Fail(this,-0x7ff5ec64);
      }
      if (this->inputLim < this->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      this->next = this->next + 1;
      goto LAB_00ec996f;
    case L')':
switchD_00ec9472_caseD_29:
      error = -0x7ff5ec67;
LAB_00ec994c:
      Fail(this,error);
      goto LAB_00ec9951;
    case L'*':
    case L'+':
      goto switchD_00ec9472_caseD_2a;
    case L'.':
      goto switchD_00ec9472_caseD_2e;
    }
    if ((EVar4 == L'\0') && (this->inputLim <= pEVar8)) {
      Fail(this,-0x7ff5ec67);
    }
switchD_00ec9472_caseD_25:
    pEVar8 = this->next;
    if (this->inputLim <= pEVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar3) goto LAB_00ec9ef3;
      *puVar7 = 0;
    }
    pEVar1 = this->next;
    this->next = pEVar1 + 1;
    EVar4 = *pEVar1;
    if ((ulong)(ushort)EVar4 < 0x100) {
      bVar3 = (bool)((ASCIIChars::classes[(ushort)EVar4] & 2) >> 1);
    }
    else {
      bVar3 = (EVar4 & 0xfffeU) == 0x2028;
    }
    if (bVar3 != false) {
      Fail(this,-0x7ff5fc0c);
    }
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
      TrackIfSurrogatePair
                (this,(uint)(ushort)EVar4,pEVar8,
                 (uint32)((ulong)((long)this->next - (long)pEVar8) >> 1));
    }
    if (EVar4 == L'/') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x4e7,"(!IsLiteral || c != \'/\')","!IsLiteral || c != \'/\'");
      if (!bVar3) goto LAB_00ec9ef3;
      *puVar7 = 0;
    }
  }
  else if ((ushort)EVar4 < 0x7b) {
    switch(EVar4) {
    case L'[':
      if (this->inputLim < pEVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      pEVar8 = this->next;
      this->next = pEVar8 + 1;
      this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
      this->codePointAtTempLocation = 0;
      this->tempLocationOfRange = pEVar8 + 1;
      CharacterClassPass0(this);
      this->tempLocationOfRange = (EncodedChar *)0x0;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      if (*this->next != L']') {
        Fail(this,-0x7ff5ec65);
      }
      break;
    case L'\\':
      if (this->inputLim < pEVar8 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      this->next = this->next + 1;
      bVar3 = AtomEscapePass0(this);
      if (bVar3) {
        return;
      }
      goto LAB_00ec9951;
    case L']':
      goto switchD_00ec934b_caseD_5d;
    case L'^':
      goto switchD_00ec934b_caseD_5e;
    default:
      if (EVar4 != L'?') goto switchD_00ec9472_caseD_25;
switchD_00ec9472_caseD_2a:
      bVar3 = AtQuantifier(this);
      if (bVar3) {
        error = -0x7ff5ec66;
        goto LAB_00ec994c;
      }
    }
    pEVar8 = this->next;
switchD_00ec9472_caseD_2e:
    if (this->inputLim < pEVar8 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec9ef3;
      *puVar7 = 0;
    }
    this->next = this->next + 1;
  }
  else {
    if (EVar4 == L'{') goto switchD_00ec9472_caseD_2a;
    if (EVar4 == L'|') goto switchD_00ec9472_caseD_29;
    if (EVar4 != L'}') goto switchD_00ec9472_caseD_25;
switchD_00ec934b_caseD_5d:
    if (this->inputLim <= pEVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x25d,"(!IsEOF())","!IsEOF()");
      if (!bVar3) goto LAB_00ec9ef3;
      *puVar7 = 0;
    }
    pEVar8 = this->next;
    this->next = pEVar8 + 1;
    EVar4 = *pEVar8;
    if ((ulong)(ushort)EVar4 < 0x100) {
      bVar3 = (bool)((ASCIIChars::classes[(ushort)EVar4] & 2) >> 1);
    }
    else {
      bVar3 = (EVar4 & 0xfffeU) == 0x2028;
    }
    if (bVar3 != false) {
      error = -0x7ff5fc0c;
      goto LAB_00ec994c;
    }
  }
LAB_00ec9951:
  if ((pEVar9 != (EncodedChar *)0x0) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
LAB_00ec996f:
  bVar3 = AtQuantifier(this);
  if (!bVar3) {
    return;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec9ef3;
    *puVar7 = 0;
  }
  pEVar9 = this->next;
  EVar4 = *pEVar9;
  if (1 < (ushort)EVar4 - 0x2a) {
    if (EVar4 == L'{') {
      if (this->inputLim < pEVar9 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      this->next = this->next + 1;
      CVar5 = RepeatCount(this);
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar3) goto LAB_00ec9ef3;
        *puVar7 = 0;
      }
      pEVar9 = this->next;
      if (*pEVar9 != L'}') {
        if (*pEVar9 == L',') {
          if (this->inputLim < pEVar9 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar3) goto LAB_00ec9ef3;
            *puVar7 = 0;
          }
          pEVar9 = this->next;
          this->next = pEVar9 + 1;
          if (this->inputLim < pEVar9 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar3) goto LAB_00ec9ef3;
            *puVar7 = 0;
          }
          if (*this->next != L'}') {
            CVar6 = RepeatCount(this);
            if (CVar6 < CVar5) {
              Fail(this,-0x7ff5ec67);
            }
            EVar4 = ECLookahead(this,0);
            if (EVar4 != L'}') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x50e,"(ECLookahead() == \'}\')","ECLookahead() == \'}\'");
              if (!bVar3) goto LAB_00ec9ef3;
              *puVar7 = 0;
            }
          }
          ECConsume(this,1);
          goto LAB_00ec9cee;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        lineNumber = 0x518;
        goto LAB_00ec9edb;
      }
    }
    else if (EVar4 != L'?') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      lineNumber = 0x51e;
LAB_00ec9edb:
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,lineNumber,"(false)","false");
      if (bVar3) {
        *puVar7 = 0;
        return;
      }
      goto LAB_00ec9ef3;
    }
  }
  if (this->inputLim < pEVar9 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) {
LAB_00ec9ef3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  this->next = this->next + 1;
LAB_00ec9cee:
  OptNonGreedy(this);
  return;
}

Assistant:

void Parser<P, IsLiteral>::TermPass0(int depth)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        // Either we have a location at the start, or the end, never both. As in between it should have been cleared if surrogate pair
        // Or must be cleared if we didn't perform the check
        bool clearLocationIfPresent = this->tempLocationOfSurrogatePair != nullptr;

        switch (ECLookahead())
        {
        case '^':
        case '$':
            ECConsume();
            return;
        case '\\':
            ECConsume();
            if (AtomEscapePass0())
                return;
            break;
        case '(':
            // Can't combine into a single codeunit because of group present
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            clearLocationIfPresent = false;
            ECConsume();
            switch (ECLookahead())
            {
            case '?':
                if (!ECCanConsume(2))
                    Fail(JSERR_RegExpSyntax);
                switch (ECLookahead(1))
                {
                case '=':
                case '!':
                case ':':
                    ECConsume(2);
                    break;
                default:
                    numGroups++;
                    break;
                }
                break;
            default:
                numGroups++;
                break;
            }
            DisjunctionPass0(depth + 1);
            ECMust(')', JSERR_RegExpNoParen);
            break;
        case '.':
            ECConsume();
            break;
        case '[':
            ECConsume();
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
            this->tempLocationOfRange = next;
            CharacterClassPass0();
            this->tempLocationOfRange = nullptr;
            ECMust(']', JSERR_RegExpNoBracket);
            break;
        case ')':
        case '|':
            Fail(JSERR_RegExpSyntax);
            break;
        case ']':
        case '}':
            NextChar();
            break;
        case '*':
        case '+':
        case '?':
        case '{':
            if (AtQuantifier())
                Fail(JSERR_RegExpBadQuant);
            else
                ECConsume();
            break;
        case 0:
            if (IsEOF())
                // Terminating 0
                Fail(JSERR_RegExpSyntax);
            // else fall-through for embedded 0
        default:
            {
                const EncodedChar* current = next;
                Char c = NextChar();
                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(c, current, (uint32)(next - current));
                }
                // Closing '/' in literals should be caught explicitly
                Assert(!IsLiteral || c != '/');
            }
            break;
        }

        if (clearLocationIfPresent && this->tempLocationOfSurrogatePair != nullptr)
        {
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (AtQuantifier())
        {
            switch (ECLookahead())
            {
            case '*':
            case '+':
            case '?':
                ECConsume();
                OptNonGreedy();
                break;
            case '{':
                {
                    ECConsume();
                    CharCount lower = RepeatCount();
                    switch (ECLookahead())
                    {
                    case ',':
                        ECConsume();
                        if (ECLookahead() == '}')
                        {
                            ECConsume();
                            OptNonGreedy();
                        }
                        else
                        {
                            CharCount upper = RepeatCount();
                            if (upper < lower)
                                Fail(JSERR_RegExpSyntax);
                            Assert(ECLookahead() == '}');
                            ECConsume();
                            OptNonGreedy();
                        }
                        break;
                    case '}':
                        ECConsume();
                        OptNonGreedy();
                        break;
                    default:
                        Assert(false);
                        break;
                    }
                    break;
                }
            default:
                Assert(false);
                break;
            }
        }
    }